

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

MontgomeryPoint * ecc_montgomery_double(MontgomeryPoint *P)

{
  MontgomeryCurve *pMVar1;
  MontgomeryPoint *pMVar2;
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  mp_int *y;
  mp_int *pmVar3;
  mp_int *x_02;
  mp_int *x_03;
  mp_int *y_00;
  mp_int *y_01;
  mp_int *pmVar4;
  
  pMVar1 = P->mc;
  pMVar2 = (MontgomeryPoint *)safemalloc(1,0x18,0);
  pMVar2->mc = pMVar1;
  pMVar2->X = (mp_int *)0x0;
  pMVar2->Z = (mp_int *)0x0;
  x = monty_sub(pMVar1->mc,P->X,P->Z);
  x_00 = monty_add(pMVar1->mc,P->X,P->Z);
  x_01 = monty_mul(pMVar1->mc,x,x);
  y = monty_mul(pMVar1->mc,x_00,x_00);
  pmVar3 = monty_mul(pMVar1->mc,x_01,y);
  pMVar2->X = pmVar3;
  pmVar3 = monty_mul(pMVar1->mc,P->X,P->Z);
  x_02 = monty_add(pMVar1->mc,pmVar3,pmVar3);
  x_03 = monty_add(pMVar1->mc,x_02,x_02);
  y_00 = monty_mul(pMVar1->mc,x_03,pMVar1->aplus2over4);
  y_01 = monty_add(pMVar1->mc,x_01,y_00);
  pmVar4 = monty_mul(pMVar1->mc,x_03,y_01);
  pMVar2->Z = pmVar4;
  mp_free(x);
  mp_free(x_00);
  mp_free(x_01);
  mp_free(y);
  mp_free(pmVar3);
  mp_free(x_02);
  mp_free(x_03);
  mp_free(y_00);
  mp_free(y_01);
  return pMVar2;
}

Assistant:

MontgomeryPoint *ecc_montgomery_double(MontgomeryPoint *P)
{
    MontgomeryCurve *mc = P->mc;
    MontgomeryPoint *D = ecc_montgomery_point_new_empty(mc);

    /*
     * To double a point in affine coordinates, in principle you can
     * use the same technique as for Weierstrass: differentiate the
     * curve equation to get the tangent line at the input point, use
     * that to get an expression for y which you substitute back into
     * the curve equation, and subtract the known two roots (in this
     * case both the same) from the x^2 coefficient of the resulting
     * cubic.
     *
     * In this case, we don't have an input y-coordinate, so you have
     * to do a bit of extra transformation to find a formula that can
     * work without it. The tangent formula is (3x^2 + 2ax + 1)/(2y),
     * and when that appears in the final formula it will be squared -
     * so we can substitute the y^2 in the denominator for the RHS of
     * the curve equation. Put together, that gives
     *
     *   x_out = (x+1)^2 (x-1)^2 / 4(x^3+ax^2+x)
     *
     * and, as usual, the code below transforms that into projective
     * form to avoid the division.
     */

    mp_int *Px_m_Pz = monty_sub(mc->mc, P->X, P->Z);
    mp_int *Px_p_Pz = monty_add(mc->mc, P->X, P->Z);
    mp_int *Px_m_Pz_2 = monty_mul(mc->mc, Px_m_Pz, Px_m_Pz);
    mp_int *Px_p_Pz_2 = monty_mul(mc->mc, Px_p_Pz, Px_p_Pz);
    D->X = monty_mul(mc->mc, Px_m_Pz_2, Px_p_Pz_2);
    mp_int *XZ = monty_mul(mc->mc, P->X, P->Z);
    mp_int *twoXZ = monty_add(mc->mc, XZ, XZ);
    mp_int *fourXZ = monty_add(mc->mc, twoXZ, twoXZ);
    mp_int *fourXZ_scaled = monty_mul(mc->mc, fourXZ, mc->aplus2over4);
    mp_int *Zpre = monty_add(mc->mc, Px_m_Pz_2, fourXZ_scaled);
    D->Z = monty_mul(mc->mc, fourXZ, Zpre);

    mp_free(Px_m_Pz);
    mp_free(Px_p_Pz);
    mp_free(Px_m_Pz_2);
    mp_free(Px_p_Pz_2);
    mp_free(XZ);
    mp_free(twoXZ);
    mp_free(fourXZ);
    mp_free(fourXZ_scaled);
    mp_free(Zpre);

    return D;
}